

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_lsrkstep_io.c
# Opt level: O0

int LSRKStepGetNumDomEigUpdates(void *arkode_mem,long *dom_eig_num_evals)

{
  undefined8 *in_RSI;
  int retval;
  ARKodeLSRKStepMem step_mem;
  ARKodeMem ark_mem;
  ARKodeMem *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  void *in_stack_ffffffffffffffd8;
  ARKodeMem local_20;
  int local_4;
  
  local_4 = lsrkStep_AccessARKODEStepMem
                      (in_stack_ffffffffffffffd8,
                       (char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                       in_stack_ffffffffffffffc8,(ARKodeLSRKStepMem *)0x169429);
  if (local_4 == 0) {
    if (in_RSI == (undefined8 *)0x0) {
      arkProcessError(local_20,-0x16,0x1c2,"LSRKStepGetNumDomEigUpdates",
                      "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_lsrkstep_io.c"
                      ,"dom_eig_num_evals cannot be NULL");
      local_4 = -0x16;
    }
    else {
      *in_RSI = *(undefined8 *)((long)in_stack_ffffffffffffffd8 + 0x28);
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int LSRKStepGetNumDomEigUpdates(void* arkode_mem, long int* dom_eig_num_evals)
{
  ARKodeMem ark_mem;
  ARKodeLSRKStepMem step_mem;
  int retval;

  /* access ARKodeMem and ARKodeLSRKStepMem structures */
  retval = lsrkStep_AccessARKODEStepMem(arkode_mem, __func__, &ark_mem,
                                        &step_mem);
  if (retval != ARK_SUCCESS) { return retval; }

  if (dom_eig_num_evals == NULL)
  {
    arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "dom_eig_num_evals cannot be NULL");
    return ARK_ILL_INPUT;
  }

  /* get values from step_mem */
  *dom_eig_num_evals = step_mem->dom_eig_num_evals;

  return ARK_SUCCESS;
}